

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retIncrem.c
# Opt level: O3

int Abc_NtkRetimeIncremental
              (Abc_Ntk_t *pNtk,int nDelayLim,int fForward,int fMinDelay,int fOneStep,int fVerbose)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *pObj;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Abc_Ntk_t *pNtk_00;
  st__table *psVar8;
  Vec_Ptr_t *pVVar9;
  ulong uVar10;
  long lVar11;
  Abc_Ntk_t *local_40;
  Vec_Int_t *local_38;
  
  if (pNtk->nObjCounts[7] == 0) {
    iVar5 = 0;
  }
  else {
    iVar1 = pNtk->nObjCounts[8];
    iVar7 = pNtk->vObjs->nSize;
    Abc_NtkOrderCisCos(pNtk);
    if (fMinDelay == 0) {
      iVar5 = -1;
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    else {
      iVar5 = 1;
      if (fOneStep == 0) {
        iVar5 = Abc_NtkLevel(pNtk);
        iVar5 = iVar5 * 2;
      }
      pNtk_00 = Abc_NtkDup(pNtk);
      psVar8 = Abc_NtkRetimePrepareLatches(pNtk_00);
      st__free_table(psVar8);
    }
    psVar8 = Abc_NtkRetimePrepareLatches(pNtk);
    Abc_NtkRetimeShareLatches(pNtk,0);
    pVVar2 = pNtk->vBoxes;
    pNtk->vBoxes = (Vec_Ptr_t *)0x0;
    if (fMinDelay == 0) {
      if (fForward == 0) {
        local_38 = Abc_NtkRetimeCollectLatchValues(pNtk);
        local_40 = Abc_NtkRetimeBackwardInitialStart(pNtk);
      }
      else {
        Abc_NtkRetimeTranferToCopy(pNtk);
        local_38 = (Vec_Int_t *)0x0;
        local_40 = (Abc_Ntk_t *)0x0;
      }
      pVVar9 = pNtk->vObjs;
      uVar10 = (ulong)(uint)pVVar9->nSize;
      iVar5 = 0;
      while (0 < (int)uVar10) {
        lVar11 = 0;
        bVar4 = false;
        do {
          pObj = (Abc_Obj_t *)pVVar9->pArray[lVar11];
          if (((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) &&
             (iVar6 = Abc_NtkRetimeNodeIsEnabled(pObj,fForward), iVar6 != 0)) {
            bVar4 = true;
            Abc_NtkRetimeNode(pObj,fForward,1);
            bVar3 = 0x270e < iVar5;
            iVar5 = iVar5 + 1;
            if (bVar3) {
              printf("Stopped after %d latch moves.\n");
              goto LAB_00476fb6;
            }
          }
          lVar11 = lVar11 + 1;
          pVVar9 = pNtk->vObjs;
          uVar10 = (ulong)pVVar9->nSize;
        } while (lVar11 < (long)uVar10);
        if ((!bVar4) || (9999 < iVar5)) break;
      }
LAB_00476fb6:
      if (fForward == 0) {
        Abc_NtkRetimeBackwardInitialFinish(pNtk,local_40,local_38,fVerbose);
        Abc_NtkDelete(local_40);
        if (local_38->pArray != (int *)0x0) {
          free(local_38->pArray);
        }
        free(local_38);
      }
      else {
        Abc_NtkRetimeTranferFromCopy(pNtk);
      }
    }
    else {
      Abc_NtkRetimeMinDelay(pNtk,pNtk_00,nDelayLim,iVar5,fForward,fVerbose);
      Abc_NtkDelete(pNtk_00);
    }
    iVar5 = 0;
    Abc_NtkRetimeShareLatches(pNtk,0);
    pNtk->vBoxes = pVVar2;
    iVar7 = Abc_NtkRetimeFinalizeLatches(pNtk,psVar8,iVar7);
    st__free_table(psVar8);
    if (iVar7 != 0) {
      iVar5 = Abc_NtkCheck(pNtk);
      if (iVar5 == 0) {
        fwrite("Abc_NtkRetimeForward(): Network check has failed.\n",0x32,1,_stdout);
      }
      iVar5 = iVar1 - pNtk->nObjCounts[8];
    }
  }
  return iVar5;
}

Assistant:

int Abc_NtkRetimeIncremental( Abc_Ntk_t * pNtk, int nDelayLim, int fForward, int fMinDelay, int fOneStep, int fVerbose )
{
    Abc_Ntk_t * pNtkCopy = NULL;
    Vec_Ptr_t * vBoxes;
    st__table * tLatches;
    int nLatches = Abc_NtkLatchNum(pNtk);
    int nIdMaxStart = Abc_NtkObjNumMax(pNtk);
    int RetValue;
    int nIterLimit = -1; // Suppress "might be used uninitialized"
    if ( Abc_NtkNodeNum(pNtk) == 0 )
        return 0;
    // reorder CI/CO/latch inputs
    Abc_NtkOrderCisCos( pNtk );
    if ( fMinDelay ) 
    {
        nIterLimit = fOneStep? 1 : 2 * Abc_NtkLevel(pNtk);
        pNtkCopy = Abc_NtkDup( pNtk );
        tLatches = Abc_NtkRetimePrepareLatches( pNtkCopy );
        st__free_table( tLatches );
    }
    // collect latches and remove CIs/COs
    tLatches = Abc_NtkRetimePrepareLatches( pNtk );
    // share the latches
    Abc_NtkRetimeShareLatches( pNtk, 0 );    
    // save boxes
    vBoxes = pNtk->vBoxes;  pNtk->vBoxes = NULL;
    // perform the retiming
    if ( fMinDelay )
        Abc_NtkRetimeMinDelay( pNtk, pNtkCopy, nDelayLim, nIterLimit, fForward, fVerbose );
    else
        Abc_NtkRetimeOneWay( pNtk, fForward, fVerbose );
    if ( fMinDelay ) 
        Abc_NtkDelete( pNtkCopy );
    // share the latches
    Abc_NtkRetimeShareLatches( pNtk, 0 );    
    // restore boxes
    pNtk->vBoxes = vBoxes;
    // finalize the latches
    RetValue = Abc_NtkRetimeFinalizeLatches( pNtk, tLatches, nIdMaxStart );
    st__free_table( tLatches );
    if ( RetValue == 0 )
        return 0;
    // fix the COs
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeForward(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}